

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avx512_gemm.h
# Opt level: O0

void intgemm::AVX512BW::Kernels8::Quantize(float *input,int8_t *output,float quant_mult,Index size)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  byte bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  __m512 quant_mult_reg_00;
  ushort uVar17;
  byte *pbVar18;
  uint in_EDX;
  long in_RSI;
  undefined1 auVar19 [16];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  uint in_XMM0_Da;
  __m512i asint;
  __m512 quant_mult_reg;
  __m512i neg127;
  size_t overhang;
  int8_t *fast_output_end;
  float *fast_input_end;
  size_t fast_size;
  size_t kBatch;
  undefined1 local_500 [64];
  undefined1 local_4c0 [56];
  undefined8 in_stack_fffffffffffffb78;
  undefined1 in_stack_fffffffffffffb80 [56];
  undefined1 in_stack_fffffffffffffd00 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined1 local_180 [64];
  undefined1 local_140 [64];
  undefined1 local_100 [3] [64];
  
  pbVar18 = (byte *)(in_RSI + ((ulong)in_EDX & 0xfffffffffffffff0));
  QuantizeThread(in_stack_fffffffffffffd00._48_8_,in_stack_fffffffffffffd00._40_8_,
                 in_stack_fffffffffffffd00._36_4_,in_stack_fffffffffffffd00._24_8_);
  if ((in_EDX & 0xf) != 0) {
    auVar20 = vpbroadcastd_avx512f(ZEXT416(0xffffff81));
    auVar20 = vmovdqa64_avx512f(auVar20);
    auVar20 = vmovdqa64_avx512f(auVar20);
    auVar20 = vmovdqa64_avx512f(auVar20);
    auVar21 = vbroadcastss_avx512f(ZEXT416(in_XMM0_Da));
    auVar22 = vmovdqa64_avx512f(auVar21);
    vmovdqa64_avx512f(auVar22);
    quant_mult_reg_00[2] = (float)in_stack_fffffffffffffb80._0_4_;
    quant_mult_reg_00[3] = (float)in_stack_fffffffffffffb80._4_4_;
    quant_mult_reg_00[4] = (float)in_stack_fffffffffffffb80._8_4_;
    quant_mult_reg_00[5] = (float)in_stack_fffffffffffffb80._12_4_;
    quant_mult_reg_00[6] = (float)in_stack_fffffffffffffb80._16_4_;
    quant_mult_reg_00[7] = (float)in_stack_fffffffffffffb80._20_4_;
    quant_mult_reg_00[8] = (float)in_stack_fffffffffffffb80._24_4_;
    quant_mult_reg_00[9] = (float)in_stack_fffffffffffffb80._28_4_;
    quant_mult_reg_00[10] = (float)in_stack_fffffffffffffb80._32_4_;
    quant_mult_reg_00[0xb] = (float)in_stack_fffffffffffffb80._36_4_;
    quant_mult_reg_00[0xc] = (float)in_stack_fffffffffffffb80._40_4_;
    quant_mult_reg_00[0xd] = (float)in_stack_fffffffffffffb80._44_4_;
    quant_mult_reg_00[0xe] = (float)in_stack_fffffffffffffb80._48_4_;
    quant_mult_reg_00[0xf] = (float)in_stack_fffffffffffffb80._52_4_;
    quant_mult_reg_00[0] = (float)(int)in_stack_fffffffffffffb78;
    quant_mult_reg_00[1] = (float)(int)((ulong)in_stack_fffffffffffffb78 >> 0x20);
    QuantizerGrab(auVar21._32_8_,quant_mult_reg_00);
    auVar21 = vmovdqa64_avx512f(auVar22);
    auVar21 = vmovdqa64_avx512f(auVar21);
    auVar20 = vmovdqa64_avx512f(auVar20);
    vmovdqa64_avx512f(auVar21);
    auVar20 = vmovdqa64_avx512f(auVar20);
    local_4c0 = auVar20._0_56_;
    memcpy(local_1c0,local_4c0,0x40);
    memcpy(local_200,&stack0xfffffffffffffb80,0x40);
    auVar20 = vmovdqa64_avx512f(local_200);
    auVar21 = vmovdqa64_avx512f(local_1c0);
    local_140 = vmovdqa64_avx512f(auVar20);
    local_180 = vmovdqa64_avx512f(auVar21);
    auVar20 = vmovdqa64_avx512f(local_140);
    auVar21 = vmovdqa64_avx512f(local_180);
    auVar20 = vpmaxsd_avx512f(auVar20,auVar21);
    auVar20 = vmovdqa64_avx512f(auVar20);
    uVar17 = (short)(1 << ((byte)in_EDX & 0xf)) - 1;
    auVar20 = vmovdqa64_avx512f(auVar20);
    local_500 = vmovdqa64_avx512f(auVar20);
    memcpy(local_100,local_500,0x40);
    auVar20 = vmovdqa64_avx512f(local_100[0]);
    auVar20 = vmovdqa64_avx512f(auVar20);
    auVar20 = vmovdqa64_avx512f(auVar20);
    auVar19 = vpmovsdb_avx512f(auVar20);
    bVar1 = SUB21(uVar17 & 0x101,0);
    bVar2 = (bool)((byte)(uVar17 >> 1) & 1);
    bVar3 = (bool)((byte)(uVar17 >> 2) & 1);
    bVar4 = (bool)((byte)(uVar17 >> 3) & 1);
    bVar5 = (bool)((byte)(uVar17 >> 4) & 1);
    bVar6 = (bool)((byte)(uVar17 >> 5) & 1);
    bVar7 = (bool)((byte)(uVar17 >> 6) & 1);
    bVar8 = (bool)((byte)(uVar17 >> 7) & 1);
    bVar9 = (byte)(uVar17 >> 8);
    bVar10 = SUB21((uVar17 & 0x101) >> 8,0);
    bVar11 = (bool)(bVar9 >> 1 & 1);
    bVar12 = (bool)(bVar9 >> 2 & 1);
    bVar13 = (bool)(bVar9 >> 3 & 1);
    bVar14 = (bool)(bVar9 >> 4 & 1);
    bVar15 = (bool)(bVar9 >> 5 & 1);
    bVar16 = (bool)(bVar9 >> 6 & 1);
    *pbVar18 = bVar1 * auVar19[0] | !bVar1 * *pbVar18;
    pbVar18[1] = bVar2 * auVar19[1] | !bVar2 * pbVar18[1];
    pbVar18[2] = bVar3 * auVar19[2] | !bVar3 * pbVar18[2];
    pbVar18[3] = bVar4 * auVar19[3] | !bVar4 * pbVar18[3];
    pbVar18[4] = bVar5 * auVar19[4] | !bVar5 * pbVar18[4];
    pbVar18[5] = bVar6 * auVar19[5] | !bVar6 * pbVar18[5];
    pbVar18[6] = bVar7 * auVar19[6] | !bVar7 * pbVar18[6];
    pbVar18[7] = bVar8 * auVar19[7] | !bVar8 * pbVar18[7];
    pbVar18[8] = bVar10 * auVar19[8] | !bVar10 * pbVar18[8];
    pbVar18[9] = bVar11 * auVar19[9] | !bVar11 * pbVar18[9];
    pbVar18[10] = bVar12 * auVar19[10] | !bVar12 * pbVar18[10];
    pbVar18[0xb] = bVar13 * auVar19[0xb] | !bVar13 * pbVar18[0xb];
    pbVar18[0xc] = bVar14 * auVar19[0xc] | !bVar14 * pbVar18[0xc];
    pbVar18[0xd] = bVar15 * auVar19[0xd] | !bVar15 * pbVar18[0xd];
    pbVar18[0xe] = bVar16 * auVar19[0xe] | !bVar16 * pbVar18[0xe];
    pbVar18[0xf] = -((char)bVar9 >> 7) * auVar19[0xf] | !(bool)-((char)bVar9 >> 7) * pbVar18[0xf];
  }
  return;
}

Assistant:

INTGEMM_AVX512BW static void Quantize(const float *input, int8_t *output, float quant_mult, Index size) {
    assert(reinterpret_cast<uintptr_t>(input) % sizeof(__m512i) == 0);
    const std::size_t kBatch = sizeof(__m512i) / sizeof(float);
    std::size_t fast_size = (size & ~(kBatch - 1));
    const float *fast_input_end = input + fast_size;
    int8_t *fast_output_end = output + fast_size;
#pragma omp parallel
    {
      QuantizeThread(input, output, quant_mult, fast_size);
    }
    std::size_t overhang = size & (kBatch - 1);
    if (!overhang) return; // We needed a branch anyway for the empty case.
    const __m512i neg127 = _mm512_set1_epi32(-127);
    const __m512 quant_mult_reg = _mm512_set1_ps(quant_mult);
    __m512i asint = QuantizerGrab(fast_input_end, quant_mult_reg);
    asint = _mm512_max_epi32(asint, neg127);
    _mm512_mask_cvtsepi32_storeu_epi8(fast_output_end, (1 << overhang) - 1, asint);
  }